

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

opj_pi_iterator_t * pi_create_decode(opj_image_t *image,opj_cp_t *cp,int tileno)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  opj_tcp_t *poVar5;
  opj_tccp_t *poVar6;
  opj_image_comp_t *poVar7;
  bool bVar8;
  int iVar9;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar10;
  opj_pi_resolution_t *poVar11;
  short *psVar12;
  opj_poc_t *poVar13;
  OPJ_PROG_ORDER *pOVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  int iVar18;
  OPJ_UINT32 OVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  size_t __nmemb;
  uint uVar23;
  OPJ_UINT32 OVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  OPJ_UINT32 local_c0;
  long local_78;
  
  poVar5 = cp->tcps;
  pi = (opj_pi_iterator_t *)calloc((long)poVar5[tileno].numpocs + 1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_001f9e36:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else if (-1 < poVar5[tileno].numpocs) {
    lVar22 = 0;
    do {
      iVar9 = tileno / cp->tw;
      iVar18 = tileno % cp->tw;
      iVar29 = cp->tx0;
      iVar1 = cp->tdx;
      OVar24 = iVar1 * iVar18 + iVar29;
      if ((int)OVar24 <= (int)image->x0) {
        OVar24 = image->x0;
      }
      pi[lVar22].tx0 = OVar24;
      iVar2 = cp->ty0;
      iVar26 = cp->tdy;
      OVar24 = iVar26 * iVar9 + iVar2;
      if ((int)OVar24 <= (int)image->y0) {
        OVar24 = image->y0;
      }
      pi[lVar22].ty0 = OVar24;
      OVar24 = (iVar18 + 1) * iVar1 + iVar29;
      if ((int)image->x1 <= (int)OVar24) {
        OVar24 = image->x1;
      }
      pi[lVar22].tx1 = OVar24;
      OVar24 = (iVar9 + 1) * iVar26 + iVar2;
      if ((int)image->y1 <= (int)OVar24) {
        OVar24 = image->y1;
      }
      pi[lVar22].ty1 = OVar24;
      uVar3 = image->numcomps;
      pi[lVar22].numcomps = uVar3;
      poVar10 = (opj_pi_comp_t *)calloc((ulong)uVar3,0x18);
      pi[lVar22].comps = poVar10;
      if (poVar10 == (opj_pi_comp_t *)0x0) {
LAB_001f9e25:
        pi_destroy(pi,cp,tileno);
        goto LAB_001f9e36;
      }
      if (pi->numcomps < 1) {
        iVar29 = 0;
        local_c0 = 0;
      }
      else {
        lVar17 = 0;
        local_78 = 0x3b0;
        local_c0 = 0;
        iVar29 = 0;
        do {
          poVar10 = pi[lVar22].comps;
          poVar6 = poVar5[tileno].tccps;
          poVar7 = image->comps;
          OVar24 = poVar7[lVar17].dx;
          poVar10[lVar17].dx = OVar24;
          OVar4 = poVar7[lVar17].dy;
          poVar10[lVar17].dy = OVar4;
          OVar19 = poVar6[lVar17].numresolutions;
          __nmemb = (size_t)(int)OVar19;
          poVar10[lVar17].numresolutions = OVar19;
          poVar11 = (opj_pi_resolution_t *)calloc(__nmemb,0x10);
          poVar10[lVar17].resolutions = poVar11;
          if (poVar11 == (opj_pi_resolution_t *)0x0) {
            pi_destroy(pi,cp,tileno);
          }
          else {
            if ((int)local_c0 < (int)OVar19) {
              local_c0 = OVar19;
            }
            if (0 < (int)OVar19) {
              iVar1 = pi->ty1;
              iVar9 = pi->tx1;
              iVar18 = pi->ty0;
              iVar2 = pi->tx0;
              uVar3 = poVar6[lVar17].csty;
              lVar31 = 0;
              do {
                OVar19 = OVar19 - 1;
                if ((uVar3 & 1) == 0) {
                  (&poVar11->pdx)[lVar31] = 0xf;
                  iVar26 = 0xf;
                }
                else {
                  (&poVar11->pdx)[lVar31] = *(int *)((long)poVar6 + lVar31 + local_78 + -0x84);
                  iVar26 = *(int *)((long)poVar6->stepsizes + lVar31 + local_78 + -0x1c);
                }
                bVar15 = (byte)OVar19;
                iVar20 = 1 << (bVar15 & 0x1f);
                uVar23 = (int)((OVar24 - 1) + iVar2) / (int)OVar24 + -1 + iVar20 >> (bVar15 & 0x1f);
                uVar30 = (int)((OVar4 - 1) + iVar18) / (int)OVar4 + -1 + iVar20 >> (bVar15 & 0x1f);
                uVar25 = (int)(iVar9 + (OVar24 - 1)) / (int)OVar24 + -1 + iVar20 >> (bVar15 & 0x1f);
                uVar21 = iVar20 + (int)(iVar1 + (OVar4 - 1)) / (int)OVar4 + -1 >> (bVar15 & 0x1f);
                (&poVar11->pdy)[lVar31] = iVar26;
                bVar15 = (byte)(&poVar11->pdx)[lVar31];
                bVar16 = (byte)iVar26;
                uVar27 = -1 << (bVar16 & 0x1f);
                uVar28 = -1 << (bVar15 & 0x1f);
                iVar26 = (int)((((1 << (bVar15 & 0x1f)) + uVar25) - 1 & uVar28) - (uVar28 & uVar23))
                         >> (bVar15 & 0x1f);
                if (uVar23 == uVar25) {
                  iVar26 = 0;
                }
                iVar20 = (int)((((1 << (bVar16 & 0x1f)) + uVar21) - 1 & uVar27) - (uVar27 & uVar30))
                         >> (bVar16 & 0x1f);
                (&poVar11->pw)[lVar31] = iVar26;
                if (uVar30 == uVar21) {
                  iVar20 = 0;
                }
                (&poVar11->ph)[lVar31] = iVar20;
                if (iVar29 < iVar20 * iVar26) {
                  iVar29 = iVar20 * iVar26;
                }
                lVar31 = lVar31 + 4;
              } while (__nmemb << 2 != lVar31);
            }
          }
          if (poVar11 == (opj_pi_resolution_t *)0x0) goto LAB_001f9e36;
          lVar17 = lVar17 + 1;
          local_78 = local_78 + 0x438;
        } while (lVar17 < pi->numcomps);
      }
      pi[lVar22].step_p = 1;
      pi[lVar22].step_c = iVar29;
      OVar24 = image->numcomps;
      pi[lVar22].step_r = OVar24 * iVar29;
      pi[lVar22].step_l = OVar24 * iVar29 * local_c0;
      if (lVar22 == 0) {
        psVar12 = (short *)calloc((ulong)(local_c0 * iVar29 * OVar24 * poVar5[tileno].numlayers),2);
        pi->include = psVar12;
        if (psVar12 == (short *)0x0) goto LAB_001f9e25;
      }
      else {
        pi[lVar22].include = pi[lVar22 + -1].include;
      }
      iVar1 = poVar5[tileno].POC;
      pi[lVar22].first = 1;
      if (iVar1 == 0) {
        pi[lVar22].poc.resno0 = 0;
        pi[lVar22].poc.compno0 = 0;
        pi[lVar22].poc.layno1 = poVar5[tileno].numlayers;
        pi[lVar22].poc.resno1 = local_c0;
        pi[lVar22].poc.compno1 = OVar24;
        pOVar14 = &poVar5[tileno].prg;
      }
      else {
        poVar13 = poVar5[tileno].pocs + lVar22;
        OVar24 = poVar13->compno0;
        OVar4 = poVar13->layno1;
        OVar19 = poVar13->resno1;
        pi[lVar22].poc.resno0 = poVar13->resno0;
        pi[lVar22].poc.compno0 = OVar24;
        pi[lVar22].poc.layno1 = OVar4;
        pi[lVar22].poc.resno1 = OVar19;
        pi[lVar22].poc.compno1 = poVar13->compno1;
        pOVar14 = &poVar13->prg;
      }
      pi[lVar22].poc.prg = *pOVar14;
      pi[lVar22].poc.layno0 = 0;
      pi[lVar22].poc.precno0 = 0;
      pi[lVar22].poc.precno1 = iVar29;
      bVar8 = lVar22 < poVar5[tileno].numpocs;
      lVar22 = lVar22 + 1;
    } while (bVar8);
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_create_decode(opj_image_t *image, opj_cp_t *cp, int tileno) {
	int p, q;
	int compno, resno, pino;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;

	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {
		/* TODO: throw an error */
		return NULL;
	}

	for (pino = 0; pino < tcp->numpocs + 1; pino++) {	/* change */
		int maxres = 0;
		int maxprec = 0;
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;

		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			/* TODO: throw an error */
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_calloc(comp->numresolutions, sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi->tx0, comp->dx);
			tcy0 = int_ceildiv(pi->ty0, comp->dy);
			tcx1 = int_ceildiv(pi->tx1, comp->dx);
			tcy1 = int_ceildiv(pi->ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);
				
				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw*res->ph;
				}
				
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(image->numcomps * maxres * tcp->numlayers * maxprec, sizeof(short int));
			if(!pi[pino].include) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		if (tcp->POC == 0) {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = 0;
			pi[pino].poc.compno0 = 0;
			pi[pino].poc.layno1 = tcp->numlayers;
			pi[pino].poc.resno1 = maxres;
			pi[pino].poc.compno1 = image->numcomps;
			pi[pino].poc.prg = tcp->prg;
		} else {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = tcp->pocs[pino].resno0;
			pi[pino].poc.compno0 = tcp->pocs[pino].compno0;
			pi[pino].poc.layno1 = tcp->pocs[pino].layno1;
			pi[pino].poc.resno1 = tcp->pocs[pino].resno1;
			pi[pino].poc.compno1 = tcp->pocs[pino].compno1;
			pi[pino].poc.prg = tcp->pocs[pino].prg;
		}
		pi[pino].poc.layno0  = 0;
		pi[pino].poc.precno0 = 0; 
		pi[pino].poc.precno1 = maxprec;
			
	}
	
	return pi;
}